

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexMatchImpl<true>
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  Var pvVar2;
  JavascriptRegExp *regularExpression;
  char16_t *varName;
  void *stackAllocationPointer_00;
  
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == true) {
    stackAllocationPointer_00 = stackAllocationPointer;
    bVar1 = IsRegexSymbolMatchObservable(thisObj,scriptContext);
    if (bVar1) {
      pvVar2 = RegexEs6MatchImpl(scriptContext,thisObj,input,false,stackAllocationPointer_00);
      return pvVar2;
    }
    varName = L"String.prototype.match";
    if ((((scriptContext->config).threadConfig)->m_ES6RegExSymbols & 1U) != 0) {
      varName = L"RegExp.prototype[Symbol.match]";
    }
  }
  else {
    varName = L"String.prototype.match";
  }
  regularExpression = JavascriptRegExp::ToRegExp(thisObj,varName,scriptContext);
  pvVar2 = RegexEs5MatchImpl<true>
                     (scriptContext,regularExpression,input,noResult,stackAllocationPointer);
  return pvVar2;
}

Assistant:

Var RegexHelper::RegexMatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

        // Normally, this check would be done in JavascriptRegExp::EntrySymbolMatch. However,
        // since the lowerer inlines String.prototype.match and directly calls the helper,
        // the check then would be bypassed. That's the reason we do the check here.
        if (scriptConfig->IsES6RegExSymbolsEnabled()
            && IsRegexSymbolMatchObservable(thisObj, scriptContext))
        {
            // We don't need to pass "updateHistory" here since the call to "exec" will handle it.
            return RegexEs6MatchImpl(scriptContext, thisObj, input, noResult, stackAllocationPointer);
        }
        else
        {
            PCWSTR varName = scriptConfig->IsES6RegExSymbolsEnabled()
                ? _u("RegExp.prototype[Symbol.match]")
                : _u("String.prototype.match");
            JavascriptRegExp* regularExpression = JavascriptRegExp::ToRegExp(thisObj, varName, scriptContext);
            return RegexEs5MatchImpl<updateHistory>(scriptContext, regularExpression, input, noResult, stackAllocationPointer);
        }
    }